

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElH1.cpp
# Opt level: O3

void __thiscall
TPZCompElH1<pzshape::TPZShapeQuad>::TPZCompElH1
          (TPZCompElH1<pzshape::TPZShapeQuad> *this,TPZCompMesh *mesh,TPZGeoEl *gel,H1Family h1fam)

{
  int64_t nelem;
  TPZConnect *pTVar1;
  int i;
  ulong uVar2;
  
  *(undefined ***)
   &(this->super_TPZIntelGen<pzshape::TPZShapeQuad>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZSavable_01956328;
  TPZIntelGen<pzshape::TPZShapeQuad>::TPZIntelGen
            (&this->super_TPZIntelGen<pzshape::TPZShapeQuad>,&PTR_PTR_01951460,mesh,gel);
  *(undefined ***)
   &(this->super_TPZIntelGen<pzshape::TPZShapeQuad>).super_TPZInterpolatedElement.
    super_TPZInterpolationSpace.super_TPZCompEl = &PTR__TPZCompElH1_01951090;
  TPZVec<long>::TPZVec(&(this->fConnectIndexes).super_TPZVec<long>,0);
  (this->fConnectIndexes).super_TPZVec<long>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_0192dd28;
  (this->fConnectIndexes).super_TPZVec<long>.fStore = (this->fConnectIndexes).fExtAlloc;
  (this->fConnectIndexes).super_TPZVec<long>.fNElements = 9;
  (this->fConnectIndexes).super_TPZVec<long>.fNAlloc = 0;
  *(undefined4 *)(this->fConnectIndexes).fExtAlloc = 0xffffffff;
  *(undefined4 *)((long)(this->fConnectIndexes).fExtAlloc + 4) = 0xffffffff;
  *(undefined4 *)((this->fConnectIndexes).fExtAlloc + 1) = 0xffffffff;
  *(undefined4 *)((long)(this->fConnectIndexes).fExtAlloc + 0xc) = 0xffffffff;
  *(undefined4 *)((this->fConnectIndexes).fExtAlloc + 2) = 0xffffffff;
  *(undefined4 *)((long)(this->fConnectIndexes).fExtAlloc + 0x14) = 0xffffffff;
  *(undefined4 *)((this->fConnectIndexes).fExtAlloc + 3) = 0xffffffff;
  *(undefined4 *)((long)(this->fConnectIndexes).fExtAlloc + 0x1c) = 0xffffffff;
  *(undefined4 *)((this->fConnectIndexes).fExtAlloc + 4) = 0xffffffff;
  *(undefined4 *)((long)(this->fConnectIndexes).fExtAlloc + 0x24) = 0xffffffff;
  *(undefined4 *)((this->fConnectIndexes).fExtAlloc + 5) = 0xffffffff;
  *(undefined4 *)((long)(this->fConnectIndexes).fExtAlloc + 0x2c) = 0xffffffff;
  *(undefined4 *)((this->fConnectIndexes).fExtAlloc + 6) = 0xffffffff;
  *(undefined4 *)((long)(this->fConnectIndexes).fExtAlloc + 0x34) = 0xffffffff;
  *(undefined4 *)((this->fConnectIndexes).fExtAlloc + 7) = 0xffffffff;
  *(undefined4 *)((long)(this->fConnectIndexes).fExtAlloc + 0x3c) = 0xffffffff;
  (this->fConnectIndexes).fExtAlloc[8] = -1;
  this->fh1fam = h1fam;
  uVar2 = 0;
  do {
    nelem = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeQuad>).
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0x370))(this,uVar2 & 0xffffffff);
    (this->fConnectIndexes).super_TPZVec<long>.fStore[uVar2] = nelem;
    pTVar1 = TPZChunkVector<TPZConnect,_10>::operator[]
                       (&(mesh->fConnectVec).super_TPZChunkVector<TPZConnect,_10>,nelem);
    pTVar1->fNElConnected = pTVar1->fNElConnected + 1;
    uVar2 = uVar2 + 1;
  } while (uVar2 != 9);
  return;
}

Assistant:

TPZCompElH1<TSHAPE>::TPZCompElH1(TPZCompMesh &mesh, TPZGeoEl *gel, const H1Family h1fam) : TPZRegisterClassId(&TPZCompElH1::ClassId),
TPZIntelGen<TSHAPE>(mesh,gel), fh1fam(h1fam){

	for(int i=0;i<TSHAPE::NSides;i++) {
		fConnectIndexes[i] = this->CreateMidSideConnect(i);
		mesh.ConnectVec()[fConnectIndexes[i]].IncrementElConnected();
	}
}